

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressLiterals
                 (ZSTD_hufCTables_t *prevHuf,ZSTD_hufCTables_t *nextHuf,ZSTD_strategy strategy,
                 int disableLiteralCompression,void *dst,size_t dstCapacity,void *src,size_t srcSize
                 ,void *entropyWorkspace,size_t entropyWorkspaceSize,int bmi2)

{
  ulong uVar1;
  size_t sVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  size_t dstSize;
  ZSTD_hufCTables_t *dstCapacity_00;
  bool bVar6;
  int iVar7;
  bool bVar8;
  HUF_repeat repeat;
  uint *local_70;
  ZSTD_hufCTables_t *local_68;
  void *local_60;
  void *local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  ulong local_38;
  
  local_68 = (ZSTD_hufCTables_t *)CONCAT44(local_68._4_4_,disableLiteralCompression);
  local_38 = (ulong)(uint)bmi2;
  local_40 = entropyWorkspaceSize;
  local_58 = entropyWorkspace;
  local_70 = (uint *)dst;
  local_50 = dstCapacity;
  local_48 = ZSTD_minGain(srcSize,strategy);
  memcpy(nextHuf,prevHuf,0x404);
  sVar2 = local_50;
  if ((int)local_68 == 0) {
    repeat = prevHuf->repeatMode;
    uVar5 = 0x3f;
    if (repeat == HUF_repeat_valid) {
      uVar5 = 6;
    }
    if (uVar5 < srcSize) {
      uVar5 = ((ulong)(0x3ff < srcSize) - (ulong)(srcSize < 0x4000)) + 4;
      dstSize = local_50 - uVar5;
      if (local_50 < uVar5 || dstSize == 0) {
        sVar2 = 0xffffffffffffffba;
      }
      else {
        bVar8 = repeat == HUF_repeat_valid;
        bVar6 = srcSize < 0x401 && (int)strategy < 4;
        local_60 = src;
        local_68 = prevHuf;
        if (uVar5 == 3 && bVar8 || srcSize < 0x100) {
          uVar1 = HUF_compress1X_repeat
                            ((void *)((long)local_70 + uVar5),dstSize,src,srcSize,0xff,0xb,local_58,
                             local_40,(HUF_CElt *)nextHuf,&repeat,(uint)bVar6,(int)local_38);
        }
        else {
          uVar1 = HUF_compress4X_repeat
                            ((void *)((long)local_70 + uVar5),dstSize,src,srcSize,0xff,0xb,local_58,
                             local_40,(HUF_CElt *)nextHuf,&repeat,(uint)bVar6,(int)local_38);
        }
        uVar3 = 3 - (repeat == HUF_repeat_none);
        if (uVar1 < srcSize - local_48 && uVar1 - 1 < 0xffffffffffffff88) {
          if (uVar1 == 1) {
            dstCapacity_00 = local_68;
            memcpy(nextHuf,local_68,0x404);
            sVar2 = ZSTD_compressRleLiteralsBlock(local_70,(size_t)dstCapacity_00,local_60,srcSize);
          }
          else {
            if (repeat == HUF_repeat_none) {
              nextHuf->repeatMode = HUF_repeat_check;
            }
            iVar7 = (int)srcSize;
            iVar4 = (int)uVar1;
            if (uVar5 == 5) {
              *local_70 = iVar4 * 0x400000 + iVar7 * 0x10 | uVar3 | 0xc;
              *(char *)(local_70 + 1) = (char)(uVar1 >> 10);
            }
            else if (uVar5 == 4) {
              *local_70 = iVar4 * 0x40000 + iVar7 * 0x10 | uVar3 | 8;
            }
            else {
              iVar4 = iVar4 * 0x4000 +
                      ((uVar3 | iVar7 * 0x10 + (uint)(uVar5 == 3 && bVar8 || srcSize < 0x100) * 4) ^
                      4);
              *(short *)local_70 = (short)iVar4;
              *(char *)((long)local_70 + 2) = (char)((uint)iVar4 >> 0x10);
            }
            sVar2 = uVar1 + uVar5;
          }
        }
        else {
          memcpy(nextHuf,local_68,0x404);
          sVar2 = ZSTD_noCompressLiterals(local_70,sVar2,local_60,srcSize);
        }
      }
      return sVar2;
    }
  }
  sVar2 = ZSTD_noCompressLiterals(local_70,local_50,src,srcSize);
  return sVar2;
}

Assistant:

size_t ZSTD_compressLiterals (ZSTD_hufCTables_t const* prevHuf,
                              ZSTD_hufCTables_t* nextHuf,
                              ZSTD_strategy strategy, int disableLiteralCompression,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                              void* entropyWorkspace, size_t entropyWorkspaceSize,
                        const int bmi2)
{
    size_t const minGain = ZSTD_minGain(srcSize, strategy);
    size_t const lhSize = 3 + (srcSize >= 1 KB) + (srcSize >= 16 KB);
    BYTE*  const ostart = (BYTE*)dst;
    U32 singleStream = srcSize < 256;
    symbolEncodingType_e hType = set_compressed;
    size_t cLitSize;

    DEBUGLOG(5,"ZSTD_compressLiterals (disableLiteralCompression=%i)",
                disableLiteralCompression);

    /* Prepare nextEntropy assuming reusing the existing table */
    memcpy(nextHuf, prevHuf, sizeof(*prevHuf));

    if (disableLiteralCompression)
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);

    /* small ? don't even attempt compression (speed opt) */
#   define COMPRESS_LITERALS_SIZE_MIN 63
    {   size_t const minLitSize = (prevHuf->repeatMode == HUF_repeat_valid) ? 6 : COMPRESS_LITERALS_SIZE_MIN;
        if (srcSize <= minLitSize) return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);
    }

    RETURN_ERROR_IF(dstCapacity < lhSize+1, dstSize_tooSmall, "not enough space for compression");
    {   HUF_repeat repeat = prevHuf->repeatMode;
        int const preferRepeat = strategy < ZSTD_lazy ? srcSize <= 1024 : 0;
        if (repeat == HUF_repeat_valid && lhSize == 3) singleStream = 1;
        cLitSize = singleStream ?
            HUF_compress1X_repeat(
                ostart+lhSize, dstCapacity-lhSize, src, srcSize,
                HUF_SYMBOLVALUE_MAX, HUF_TABLELOG_DEFAULT, entropyWorkspace, entropyWorkspaceSize,
                (HUF_CElt*)nextHuf->CTable, &repeat, preferRepeat, bmi2) :
            HUF_compress4X_repeat(
                ostart+lhSize, dstCapacity-lhSize, src, srcSize,
                HUF_SYMBOLVALUE_MAX, HUF_TABLELOG_DEFAULT, entropyWorkspace, entropyWorkspaceSize,
                (HUF_CElt*)nextHuf->CTable, &repeat, preferRepeat, bmi2);
        if (repeat != HUF_repeat_none) {
            /* reused the existing table */
            hType = set_repeat;
        }
    }

    if ((cLitSize==0) | (cLitSize >= srcSize - minGain) | ERR_isError(cLitSize)) {
        memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);
    }
    if (cLitSize==1) {
        memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
        return ZSTD_compressRleLiteralsBlock(dst, dstCapacity, src, srcSize);
    }

    if (hType == set_compressed) {
        /* using a newly constructed table */
        nextHuf->repeatMode = HUF_repeat_check;
    }

    /* Build header */
    switch(lhSize)
    {
    case 3: /* 2 - 2 - 10 - 10 */
        {   U32 const lhc = hType + ((!singleStream) << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<14);
            MEM_writeLE24(ostart, lhc);
            break;
        }
    case 4: /* 2 - 2 - 14 - 14 */
        {   U32 const lhc = hType + (2 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<18);
            MEM_writeLE32(ostart, lhc);
            break;
        }
    case 5: /* 2 - 2 - 18 - 18 */
        {   U32 const lhc = hType + (3 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<22);
            MEM_writeLE32(ostart, lhc);
            ostart[4] = (BYTE)(cLitSize >> 10);
            break;
        }
    default:  /* not possible : lhSize is {3,4,5} */
        assert(0);
    }
    return lhSize+cLitSize;
}